

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuMatrix.hpp
# Opt level: O2

Matrix<double,_2,_2> * __thiscall
tcu::Matrix<double,_2,_2>::operator=(Matrix<double,_2,_2> *this,Matrix<double,_2,_2> *src)

{
  long lVar1;
  
  for (lVar1 = 2; lVar1 != 4; lVar1 = lVar1 + 1) {
    *(undefined8 *)((long)((this->m_data).m_data + -1) + lVar1 * 8) =
         *(undefined8 *)((long)((src->m_data).m_data + -1) + lVar1 * 8);
    (this->m_data).m_data[0].m_data[lVar1] = (src->m_data).m_data[0].m_data[lVar1];
  }
  return this;
}

Assistant:

Matrix<T, Rows, Cols>& Matrix<T, Rows, Cols>::operator= (const Matrix<T, Rows, Cols>& src)
{
	for (int row = 0; row < Rows; row++)
		for (int col = 0; col < Cols; col++)
			(*this)(row, col) = src(row, col);
	return *this;
}